

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cpp
# Opt level: O2

void __thiscall daw::curl_wrapper::reset(curl_wrapper *this)

{
  _Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false> _Var1;
  CURL *__p;
  
  impl_t::reset((this->m_impl)._M_t.
                super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
                ._M_t.
                super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
                .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>._M_head_impl);
  _Var1._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
       .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>._M_head_impl;
  __p = cw_details::anon_unknown_0::init_curl();
  std::__uniq_ptr_impl<void,_daw::cw_details::curl_deleter>::reset
            ((__uniq_ptr_impl<void,_daw::cw_details::curl_deleter> *)&(_Var1._M_head_impl)->curl,__p
            );
  return;
}

Assistant:

void curl_wrapper::reset( ) {
		m_impl->reset( );
		m_impl->curl.reset( cw_details::init_curl( ) );
	}